

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_mcrfs(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *s;
  uintptr_t o_2;
  TCGTemp *ts;
  TCGTemp *a1;
  TCGv_i32 pTVar2;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 ret;
  uint uVar3;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  if (ctx->fpu_enabled != false) {
    ret = (TCGv_i64)((long)a1 - (long)s);
    uVar3 = ~ctx->opcode >> 0x12 & 7;
    uVar1 = uVar3 * 4;
    tcg_gen_shri_i64_ppc64(s,(TCGv_i64)((long)ts - (long)s),cpu_fpscr,(ulong)uVar1);
    tcg_gen_extrl_i64_i32_ppc64
              (s,*(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38)),
               (TCGv_i64)((long)ts - (long)s));
    pTVar2 = *(TCGv_i32 *)((long)cpu_crf + (ulong)(ctx->opcode >> 0x14 & 0x38));
    tcg_gen_andi_i32_ppc64(s,pTVar2,pTVar2,0xf);
    tcg_temp_free_internal_ppc64(s,ts);
    if (cpu_fpscr != ret) {
      tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(cpu_fpscr + (long)s));
    }
    tcg_gen_andi_i64_ppc64(s,ret,ret,~(ulong)(0xf << (sbyte)uVar1 & 0x9ff80700));
    pTVar2 = tcg_const_i32_ppc64(s,1 << (sbyte)uVar3);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = (TCGTemp *)(ret + (long)s);
    local_38 = (TCGTemp *)(pTVar2 + (long)s);
    tcg_gen_callN_ppc64(s,helper_store_fpscr,(TCGTemp *)0x0,3,&local_48);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar2 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_mcrfs(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv tmp = tcg_temp_new(tcg_ctx);
    TCGv_i32 tmask;
    TCGv_i64 tnew_fpscr = tcg_temp_new_i64(tcg_ctx);
    int bfa;
    int nibble;
    int shift;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    bfa = crfS(ctx->opcode);
    nibble = 7 - bfa;
    shift = 4 * nibble;
    tcg_gen_shri_tl(tcg_ctx, tmp, cpu_fpscr, shift);
    tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[crfD(ctx->opcode)], tmp);
    tcg_gen_andi_i32(tcg_ctx, cpu_crf[crfD(ctx->opcode)], cpu_crf[crfD(ctx->opcode)],
                     0xf);
    tcg_temp_free(tcg_ctx, tmp);
    tcg_gen_extu_tl_i64(tcg_ctx, tnew_fpscr, cpu_fpscr);
    /* Only the exception bits (including FX) should be cleared if read */
    tcg_gen_andi_i64(tcg_ctx, tnew_fpscr, tnew_fpscr,
                     ~((0xF << shift) & FP_EX_CLEAR_BITS));
    /* FEX and VX need to be updated, so don't set fpscr directly */
    tmask = tcg_const_i32(tcg_ctx, 1 << nibble);
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, tnew_fpscr, tmask);
    tcg_temp_free_i32(tcg_ctx, tmask);
    tcg_temp_free_i64(tcg_ctx, tnew_fpscr);
}